

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.h
# Opt level: O0

void __thiscall HighsSparseMatrix::~HighsSparseMatrix(HighsSparseMatrix *this)

{
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  CLI::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

HighsSparseMatrix() { clear(); }